

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.hpp
# Opt level: O3

void __thiscall antlr::CommonToken::CommonToken(CommonToken *this,int t,string *txt)

{
  pointer pcVar1;
  
  (this->super_Token).ref = (TokenRef *)0x0;
  (this->super_Token).type = t;
  (this->super_Token)._vptr_Token = (_func_int **)&PTR__CommonToken_00305378;
  *(undefined8 *)&(this->super_Token).field_0x14 = 0x100000001;
  (this->text)._M_dataplus._M_p = (pointer)&(this->text).field_2;
  pcVar1 = (txt->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->text,pcVar1,pcVar1 + txt->_M_string_length);
  return;
}

Assistant:

Token(int t)
	: ref(0)
	, type(t)
	{
	}